

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFileUnpacker.cpp
# Opt level: O0

bool __thiscall DatUnpacker::DatFileUnpacker::unpack(DatFileUnpacker *this,Arguments *arguments)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *this_00;
  reference ppDVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  ostream *this_01;
  uchar *puVar4;
  char local_788 [8];
  ofstream stream;
  path local_588;
  undefined1 local_560 [8];
  string directory;
  undefined1 local_520 [8];
  string fullpath;
  char local_4da [2];
  char *local_4d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  undefined1 local_4c8 [8];
  string name;
  DatFileItem *item;
  iterator __end1;
  iterator __begin1;
  vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *__range1;
  string local_478;
  undefined1 local_458 [8];
  DatFile datFile;
  Arguments *arguments_local;
  DatFileUnpacker *this_local;
  
  datFile._items =
       (vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *)arguments;
  std::__cxx11::string::string((string *)&local_478,(string *)&arguments->source);
  DatFile::DatFile((DatFile *)local_458,&local_478,false);
  std::__cxx11::string::~string((string *)&local_478);
  DatFile::version((DatFile *)local_458);
  bVar1 = checkDatFile(this,(DatFile *)local_458,(Arguments *)datFile._items);
  if (bVar1) {
    this_00 = DatFile::items((DatFile *)local_458);
    __end1 = std::vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>::
             begin(this_00);
    item = (DatFileItem *)
           std::vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>::end
                     (this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<DatUnpacker::DatFileItem_**,_std::vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>_>
                                       *)&item), bVar1) {
      ppDVar3 = __gnu_cxx::
                __normal_iterator<DatUnpacker::DatFileItem_**,_std::vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>_>
                ::operator*(&__end1);
      name.field_2._8_8_ = *ppDVar3;
      DatFileItem::name_abi_cxx11_((string *)local_4c8,(DatFileItem *)name.field_2._8_8_);
      local_4d0._M_current = (char *)std::__cxx11::string::begin();
      local_4d8 = (char *)std::__cxx11::string::end();
      local_4da[1] = 0x5c;
      local_4da[0] = '/';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_4d0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_4d8,local_4da + 1,local_4da);
      if (((ulong)((datFile._items)->
                  super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
                  )._M_impl.super__Vector_impl_data._M_start & 0x100) != 0) {
        __first._M_current = (char *)std::__cxx11::string::begin();
        __last._M_current = (char *)std::__cxx11::string::end();
        __result._M_current = (char *)std::__cxx11::string::begin();
        fullpath.field_2._8_8_ =
             std::
             transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                       (__first,__last,__result,tolower);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&directory.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &datFile._items[1].
                      super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&directory.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8)
      ;
      std::__cxx11::string::~string((string *)(directory.field_2._M_local_buf + 8));
      std::__cxx11::string::find_last_of((char)local_520,0x2f);
      std::__cxx11::string::substr((ulong)local_560,(ulong)local_520);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_588,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560,
                 auto_format);
      std::filesystem::create_directories(&local_588);
      std::filesystem::__cxx11::path::~path(&local_588);
      if (((ulong)((datFile._items)->
                  super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
                  )._M_impl.super__Vector_impl_data._M_start & 1) == 0) {
        this_01 = std::operator<<((ostream *)&std::cout,(string *)local_520);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      }
      std::ofstream::ofstream(local_788);
      _Var2 = std::__cxx11::string::c_str();
      std::operator|(_S_out,_S_bin);
      std::ofstream::open(local_788,_Var2);
      puVar4 = DatFileItem::data((DatFileItem *)name.field_2._8_8_);
      DatFileItem::unpackedSize((DatFileItem *)name.field_2._8_8_);
      std::ostream::write(local_788,(long)puVar4);
      std::ofstream::close();
      puVar4 = DatFileItem::data((DatFileItem *)name.field_2._8_8_);
      if (puVar4 != (uchar *)0x0) {
        operator_delete__(puVar4);
      }
      std::ofstream::~ofstream(local_788);
      std::__cxx11::string::~string((string *)local_560);
      std::__cxx11::string::~string((string *)local_520);
      std::__cxx11::string::~string((string *)local_4c8);
      __gnu_cxx::
      __normal_iterator<DatUnpacker::DatFileItem_**,_std::vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  DatFile::~DatFile((DatFile *)local_458);
  return this_local._7_1_;
}

Assistant:

bool DatFileUnpacker::unpack(const Arguments& arguments)
    {
        DatFile datFile(arguments.source);

        //if (arguments.format == Format::FALLOUT2) {
        //    datFile.setVersion(DatFile::VERSION::FALLOUT2);
        //} else {
        //    datFile.setVersion(DatFile::VERSION::FALLOUT1);
        //}

        // TODO: refactor DatFile to get rid of this call
        if (datFile.version()) {

        }

        if (!checkDatFile(datFile, arguments)) {
            return false;
        }

        // extract items
        for (auto item : *datFile.items()) {

            std::string name = item->name();
            std::replace(name.begin(), name.end(), '\\', '/');

            if (arguments.transformNames) {
                std::transform(name.begin(), name.end(), name.begin(), ::tolower);
            }

            std::string fullpath = arguments.destination + "/" + name;
            std::string directory = fullpath.substr(0, fullpath.find_last_of('/'));

            std::filesystem::create_directories(directory);

            if (!arguments.quietMode) {
                std::cout << fullpath << std::endl;
            }

            std::ofstream stream;
            stream.open(fullpath.c_str(), std::ofstream::out | std::ofstream::binary);
            stream.write((char*)item->data(), item->unpackedSize());
            stream.close();
            delete [] item->data();
        }

        return true;
    }